

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O2

void __thiscall libtorrent::torrent_info::free_piece_layers(torrent_info *this)

{
  ::std::
  vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::clear(&(this->m_piece_layers).
           super_vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
         );
  ::std::
  vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::_M_shrink_to_fit(&(this->m_piece_layers).
                      super_vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
                    );
  (this->m_flags).m_val = (this->m_flags).m_val & 0xef;
  return;
}

Assistant:

void torrent_info::free_piece_layers()
	{
		m_piece_layers.clear();
		m_piece_layers.shrink_to_fit();

		m_flags &= ~v2_has_piece_hashes;
	}